

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

int __thiscall Path::mkdir(Path *this,char *__path,__mode_t __mode)

{
  char *__src;
  int iVar1;
  uint *puVar2;
  int iVar3;
  undefined8 unaff_RBP;
  undefined8 uVar4;
  size_t s;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  char buf [4098];
  undefined8 uStack_1040;
  char acStack_1038 [4104];
  undefined7 uVar5;
  
  uStack_1040 = 0x150066;
  puVar2 = (uint *)__errno_location();
  *puVar2 = 0;
  uStack_1040 = 0x150079;
  iVar1 = ::mkdir((this->super_String).mString._M_dataplus._M_p,__mode);
  uVar5 = (undefined7)((ulong)unaff_RBP >> 8);
  iVar3 = (int)CONCAT71(uVar5,1);
  if ((iVar1 != 0) && ((*puVar2 | 4) != 0x15)) {
    if (((int)__path == 0) ||
       (uVar6 = (this->super_String).mString._M_string_length, 0x1000 < uVar6)) {
      iVar3 = 0;
    }
    else {
      __src = (this->super_String).mString._M_dataplus._M_p;
      uStack_1040 = 0x1500c5;
      strcpy(acStack_1038,__src);
      if ((uVar6 == 0) || (__src[uVar6 - 1] != '/')) {
        (acStack_1038 + uVar6)[0] = '/';
        (acStack_1038 + uVar6)[1] = '\0';
        uVar6 = uVar6 + 1;
      }
      uVar4 = CONCAT71(uVar5,uVar6 < 2);
      iVar3 = (int)uVar4;
      if (uVar6 >= 2) {
        uVar7 = 2;
        do {
          if (*(char *)((long)&uStack_1040 + uVar7 + 7) == '/') {
            *(undefined1 *)((long)&uStack_1040 + uVar7 + 7) = 0;
            uStack_1040 = 0x15010d;
            iVar1 = ::mkdir(acStack_1038,__mode);
            if ((iVar1 != 0) && ((*puVar2 | 4) != 0x15)) {
              return (int)uVar4;
            }
            *(undefined1 *)((long)&uStack_1040 + uVar7 + 7) = 0x2f;
          }
          uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),uVar6 <= uVar7);
          iVar3 = (int)uVar4;
          bVar8 = uVar7 != uVar6;
          uVar7 = uVar7 + 1;
        } while (bVar8);
      }
    }
  }
  return iVar3;
}

Assistant:

bool Path::mkdir(const Path &path, MkDirMode mkdirMode, mode_t permissions)
{
    errno = 0;
#ifdef _WIN32
    (void) permissions;   // unused on windows
    if (!::_wmkdir(Utf8To16(path.c_str())) || errno == EEXIST)
#else
    if (!::mkdir(path.constData(), permissions) || errno == EEXIST || errno == EISDIR)
#endif
    {
        // mkdir call succeeded or it failed because the dir already exists
        return true;
    }
    if (mkdirMode == Single)
        return false;
    if (path.size() > PATH_MAX)
        return false;

    // directory creation failed so far
    // because mkdirMode == Recursive, we go along the path and create
    // directories, continuing while dir creation is successful or it failed
    // only because directories already exist.

    char buf[PATH_MAX + 2];
    strcpy(buf, path.constData());
    size_t len = path.size();
    if (!path.endsWith('/')) {
        buf[len++] = '/';
        buf[len] = '\0';
    }

    for (size_t i = 1; i < len; ++i) {
        if (buf[i] == '/') {
            buf[i] = 0;
#ifdef _WIN32
            Utf8To16 tmp2(buf);
            const int r = ::_wmkdir(tmp2);
#else
            const int r = ::mkdir(buf, permissions);
#endif
            if (r && errno != EEXIST && errno != EISDIR)
                return false;
            buf[i] = '/';
        }
    }
    return true;
}